

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

void __thiscall sing::HttpContext::~HttpContext(HttpContext *this)

{
  HttpContext *this_local;
  
  close(this->fd);
  std::weak_ptr<sing::Timer>::~weak_ptr(&this->timer);
  HttpResponse::~HttpResponse(&this->response);
  HttpRequest::~HttpRequest(&this->request);
  Buffer::~Buffer(&this->output);
  Buffer::~Buffer(&this->input);
  return;
}

Assistant:

HttpContext::~HttpContext(){
    close(fd);// FIX ME
}